

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O0

int64_t client_seek_proxy(archive_read_filter *self,int64_t offset,int whence)

{
  undefined4 in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 local_8;
  
  if (*(long *)(*(long *)(in_RDI + 0x18) + 0xd8) == 0) {
    local_8 = -0x19;
  }
  else {
    local_8 = (**(code **)(*(long *)(in_RDI + 0x18) + 0xd8))
                        (*(undefined8 *)(in_RDI + 0x18),*(undefined8 *)(in_RDI + 0x50),in_RSI,in_EDX
                        );
  }
  return local_8;
}

Assistant:

static int64_t
client_seek_proxy(struct archive_read_filter *self, int64_t offset, int whence)
{
	/* DO NOT use the skipper here!  If we transparently handled
	 * forward seek here by using the skipper, that will break
	 * other libarchive code that assumes a successful forward
	 * seek means it can also seek backwards.
	 */
	if (self->archive->client.seeker == NULL)
		return (ARCHIVE_FAILED);
	return (self->archive->client.seeker)(&self->archive->archive,
	    self->data, offset, whence);
}